

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_22::Scanner::visitFunction(Scanner *this,Function *curr)

{
  Expression *pEVar1;
  Expression *pEVar2;
  char *pcVar3;
  char *pcVar4;
  Expression **ppEVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  __node_base *p_Var9;
  Signature SVar10;
  key_type local_38;
  
  SVar10 = HeapType::getSignature(&curr->type);
  if (SVar10.params.id.id == 0) {
    SVar10 = HeapType::getSignature(&curr->type);
    if (((SVar10.results.id.id == 0) && (pEVar1 = curr->body, pEVar1->_id == BlockId)) &&
       (1 < pEVar1[2].type.id)) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pEVar1 + 2),0);
      pEVar2 = *ppEVar5;
      if (((pEVar2->_id == IfId) && (pcVar3 = *(char **)(pEVar2 + 1), *pcVar3 == '\n')) &&
         ((*(char *)pEVar2[1].type.id == '\x13' && (*(long *)(pEVar2 + 2) == 0)))) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(pEVar1 + 2),1);
        pEVar1 = *ppEVar5;
        if (((pEVar1->_id == GlobalSetId) &&
            (pcVar4 = *(char **)(pcVar3 + 0x18), (char *)pEVar1[1].type.id == pcVar4)) &&
           ((pEVar1->type).id != 1)) {
          local_38.super_IString.str._M_len = *(size_t *)(pcVar3 + 0x10);
          local_38.super_IString.str._M_str = pcVar4;
          if (pcVar4 != (char *)0x0) {
            pmVar6 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->optInfo->onceFuncs,(key_type *)curr);
            (pmVar6->super_IString).str._M_len = local_38.super_IString.str._M_len;
            (pmVar6->super_IString).str._M_str = local_38.super_IString.str._M_str;
            pmVar7 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->readGlobals,&local_38);
            *pmVar7 = *pmVar7 - 1;
          }
        }
      }
    }
  }
  p_Var9 = &(this->readGlobals)._M_h._M_before_begin;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    if ((int)*(size_t *)(p_Var9 + 3) != 0) {
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this->optInfo,(key_type *)(p_Var9 + 1));
      LOCK();
      (pmVar8->_M_base)._M_i = false;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // TODO: support params and results?
    if (curr->getParams() == Type::none && curr->getResults() == Type::none) {
      auto global = getOnceGlobal(curr->body);
      if (global.is()) {
        // This is a "once" function, as best we can tell for now. Further
        // information may cause a problem, say, if the global is used in a bad
        // way in another function, so we may undo this.
        optInfo.onceFuncs.at(curr->name) = global;

        // We can ignore the get in the "once" pattern at the top of the
        // function.
        readGlobals[global]--;
      }
    }

    for (auto& [global, count] : readGlobals) {
      if (count > 0) {
        // This global has reads we cannot reason about, so do not optimize it.
        optInfo.onceGlobals.at(global) = false;
      }
    }
  }